

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O1

int ext_loader_impl_discover(loader_impl impl,loader_handle handle,context ctx)

{
  long *plVar1;
  code *pcVar2;
  int iVar3;
  undefined8 uVar4;
  long *plVar5;
  bool bVar6;
  loader_impl_ext_handle_lib_type ext;
  long *local_60 [2];
  long local_50 [2];
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  plVar5 = *handle;
  plVar1 = *(long **)((long)handle + 8);
  bVar6 = plVar5 != plVar1;
  if (bVar6) {
    do {
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char*>((string *)local_60,*plVar5,plVar5[1] + *plVar5);
      local_40 = (undefined4)plVar5[4];
      uStack_3c = *(undefined4 *)((long)plVar5 + 0x24);
      uStack_38 = (undefined4)plVar5[5];
      uStack_34 = *(undefined4 *)((long)plVar5 + 0x2c);
      pcVar2 = (code *)plVar5[5];
      uVar4 = loader_impl_handle_container_of(impl,handle);
      iVar3 = (*pcVar2)(impl,uVar4);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      if (iVar3 != 0) break;
      plVar5 = plVar5 + 6;
      bVar6 = plVar5 != plVar1;
    } while (bVar6);
  }
  return (uint)bVar6;
}

Assistant:

int ext_loader_impl_discover(loader_impl impl, loader_handle handle, context ctx)
{
	loader_impl_ext_handle ext_handle = static_cast<loader_impl_ext_handle>(handle);

	(void)ctx; /* We have opted by pass the handle instead of the context of the handle */

	for (auto ext : ext_handle->extensions)
	{
		loader_impl_function_cast function_cast;

		function_cast.ptr = ext.addr;

		if (function_cast.fn(impl, loader_impl_handle_container_of(impl, handle)) != 0)
		{
			return 1;
		}
	}

	return 0;
}